

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O2

void __thiscall OctetType::~OctetType(OctetType *this)

{
  (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OctetType_001175a8;
  std::__cxx11::string::~string((string *)&this->_value);
  return;
}

Assistant:

explicit OctetType(const std::string& value): BER_CONTAINER(STRING), _value(value){}